

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesDeviceGetSubDevicePropertiesExp
          (zes_device_handle_t hDevice,uint32_t *pCount,
          zes_subdevice_exp_properties_t *pSubdeviceProps)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar5 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,
             "zesDeviceGetSubDevicePropertiesExp(hDevice, pCount, pSubdeviceProps)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar5 + 0x9b8) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar5 + 0xd38) - *(long *)(lVar5 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar5 + 0x9b8);
    do {
      if (lVar3 == lVar4) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesDeviceGetSubDevicePropertiesExpPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                                hDevice,pCount,pSubdeviceProps), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hDevice,pCount,pSubdeviceProps);
          lVar5 = 0;
          goto LAB_001731c5;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar4 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x880))(plVar1,hDevice,pCount,pSubdeviceProps);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001731fe;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x888))(plVar1,hDevice,pCount,pSubdeviceProps,zVar2);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_001731c5:
    result = zVar2;
    if (lVar3 == lVar5) break;
  }
LAB_001731fe:
  logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceGetSubDevicePropertiesExp(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub devices currently attached to the device.
                                                        ///< if count is greater than the number of sub devices currently attached
                                                        ///< to the device, then the driver shall update the value with the correct
                                                        ///< number of sub devices.
        zes_subdevice_exp_properties_t* pSubdeviceProps ///< [in,out][optional][range(0, *pCount)] array of sub device property structures.
                                                        ///< if count is less than the number of sysman sub devices available, then
                                                        ///< the driver shall only retrieve that number of sub device property structures.
        )
    {
        context.logger->log_trace("zesDeviceGetSubDevicePropertiesExp(hDevice, pCount, pSubdeviceProps)");

        auto pfnGetSubDevicePropertiesExp = context.zesDdiTable.DeviceExp.pfnGetSubDevicePropertiesExp;

        if( nullptr == pfnGetSubDevicePropertiesExp )
            return logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceGetSubDevicePropertiesExpPrologue( hDevice, pCount, pSubdeviceProps );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDeviceGetSubDevicePropertiesExpPrologue( hDevice, pCount, pSubdeviceProps );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp", result);
        }

        auto driver_result = pfnGetSubDevicePropertiesExp( hDevice, pCount, pSubdeviceProps );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceGetSubDevicePropertiesExpEpilogue( hDevice, pCount, pSubdeviceProps ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
        }
        return logAndPropagateResult("zesDeviceGetSubDevicePropertiesExp", driver_result);
    }